

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix
          (ChDampingKirchhoff *this,ChMatrixRef *R,ChVector<double> *deps,ChVector<double> *dkur,
          double z_inf,double z_sup,double angle)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChMatrixRef *pCVar6;
  uint uVar7;
  ChVector<double> *pCVar8;
  ActualDstType actualDst;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  ChVectorN<double,_6> stress_1;
  ChVectorN<double,_6> dstrain_0;
  ChVector<double> m;
  ChVector<double> n;
  ChVectorN<double,_6> stress_0;
  ChVectorN<double,_6> stress_d;
  ChVector<double> ddeps;
  ChVector<double> ddkur;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_1e8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1a8 [48];
  ulong local_178;
  void *local_170;
  void *local_168;
  ulong local_160;
  void *local_158;
  void *local_150;
  ulong local_148;
  ChMatrixRef *local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *local_d0;
  SrcEvaluatorType local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  double dStack_78;
  double dStack_70;
  ChVector<double> CStack_60;
  ChVector<double> local_48;
  
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 6) {
    __assert_fail("R.rows() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                  ,0x173,
                  "virtual void chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 6) {
    local_1e8.m_src = &local_c8;
    local_1e8.m_dst = (DstEvaluatorType *)local_1a8;
    local_c8.m_functor.m_other = 0.0;
    local_1a8._0_8_ =
         (R->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_1a8._16_8_ =
         (R->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_1e8.m_functor = (assign_op<double,_double> *)&local_98;
    local_1e8.m_dstExpr = R;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_1e8);
    uVar7 = -((uint)((ulong)local_1a8 >> 3) & 0x1fffffff) & 6;
    uVar10 = 3;
    if (uVar7 < 3) {
      uVar10 = uVar7;
    }
    if (uVar7 != 0) {
      memcpy(local_1a8,deps,(ulong)(uVar10 * 8));
    }
    if (uVar10 != 3) {
      uVar12 = (ulong)(uVar10 << 3);
      memcpy(local_1a8 + uVar12,(void *)((long)deps->m_data + uVar12),0x18 - uVar12);
    }
    uVar7 = -((uint)((ulong)(local_1a8 + 0x18) >> 3) & 0x1fffffff) & 7;
    uVar10 = 3;
    if (uVar7 < 3) {
      uVar10 = uVar7;
    }
    uVar12 = (ulong)(uVar10 << 3);
    memcpy(local_1a8 + 0x18,dkur,uVar12);
    if (uVar7 < 3) {
      memcpy(local_1a8 + uVar12 + 0x18,(void *)((long)dkur->m_data + uVar12),0x18 - uVar12);
    }
    local_f8 = 0;
    uStack_f0 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_e8 = 0;
    local_108 = 0;
    (*this->_vptr_ChDampingKirchhoff[2])(z_inf,z_sup,angle);
    uVar7 = -((uint)((ulong)&local_c8 >> 3) & 0x1fffffff) & 6;
    uVar10 = 3;
    if (uVar7 < 3) {
      uVar10 = uVar7;
    }
    if (uVar7 != 0) {
      memcpy(&local_c8,&local_f8,(ulong)(uVar10 * 8));
    }
    if (uVar10 != 3) {
      uVar12 = (ulong)(uVar10 << 3);
      memcpy((void *)((long)&local_c8.m_functor.m_other + uVar12),(void *)((long)&local_f8 + uVar12)
             ,0x18 - uVar12);
    }
    uVar7 = -((uint)((ulong)(local_b8 + 8) >> 3) & 0x1fffffff) & 7;
    uVar10 = 3;
    if (uVar7 < 3) {
      uVar10 = uVar7;
    }
    uVar12 = (ulong)(uVar10 << 3);
    memcpy(local_b8 + 8,&local_118,uVar12);
    if (uVar7 < 3) {
      memcpy(local_b8 + uVar12 + 8,(void *)((long)&local_118 + uVar12),0x18 - uVar12);
    }
    local_140 = R;
    local_120 = (ulong)(-((uint)((ulong)&local_1e8 >> 3) & 0x1fffffff) & 6);
    local_128 = 3;
    if (local_120 < 3) {
      local_128 = local_120;
    }
    uVar7 = -((uint)((ulong)&local_1e8.m_dstExpr >> 3) & 0x1fffffff) & 7;
    local_130 = (ulong)uVar7;
    uVar10 = 3;
    if ((ulong)uVar7 < 3) {
      uVar10 = uVar7;
    }
    local_148 = (ulong)(uint)((int)local_128 * 8);
    lVar11 = 0;
    lVar9 = 0;
    local_138 = (ulong)(uVar10 << 3);
    local_160 = local_148 ^ 0x18;
    local_150 = (void *)((long)&local_1e8.m_dst + local_148);
    local_158 = (void *)((long)&local_f8 + local_148);
    local_178 = local_138 ^ 0x18;
    local_168 = (void *)((long)&local_1e8.m_dstExpr + local_138);
    local_170 = (void *)((long)&local_118 + local_138);
    while( true ) {
      local_1e8.m_src = (SrcEvaluatorType *)0x3;
      local_1c8 = 0;
      local_1b8 = 6;
      *(double *)(local_1a8 + lVar11) = *(double *)(local_1a8 + lVar11) + 1e-09;
      local_1e8.m_dst = (DstEvaluatorType *)local_1a8;
      local_1e8.m_dstExpr = (DstXprType *)local_1a8;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
                (&CStack_60,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                 &local_1e8,(type *)0x0);
      local_1e8.m_dst = (DstEvaluatorType *)(local_1a8 + 0x18);
      local_1e8.m_src = (SrcEvaluatorType *)0x3;
      local_1c8 = 3;
      local_1b8 = 6;
      local_1e8.m_dstExpr = (DstXprType *)local_1a8;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                 &local_1e8,(type *)0x0);
      pCVar8 = &CStack_60;
      (*this->_vptr_ChDampingKirchhoff[2])
                (z_inf,z_sup,angle,this,&local_f8,&local_118,pCVar8,&local_48);
      if (local_120 != 0) {
        memcpy(&local_1e8,&local_f8,local_148);
      }
      if ((int)local_128 != 3) {
        memcpy(local_150,local_158,local_160);
      }
      memcpy(&local_1e8.m_dstExpr,&local_118,local_138);
      pCVar6 = local_140;
      if ((uint)local_130 < 3) {
        memcpy(local_168,local_170,local_178);
      }
      local_d8 = 0x41cdcd64ffffffff;
      local_d0 = &local_1e8;
      auVar2._8_8_ = local_1e8.m_src;
      auVar2._0_8_ = local_1e8.m_dst;
      auVar3._8_8_ = local_1e8.m_dstExpr;
      auVar3._0_8_ = local_1e8.m_functor;
      auVar4._8_8_ = uStack_1c0;
      auVar4._0_8_ = local_1c8;
      auVar5._8_8_ = local_c8._8_8_;
      auVar5._0_8_ = local_c8.m_functor.m_other;
      auVar2 = vsubpd_avx(auVar2,auVar5);
      local_98 = auVar2._0_8_ * 999999999.9999999;
      dStack_90 = auVar2._8_8_ * 999999999.9999999;
      auVar2 = vsubpd_avx(auVar3,local_b8);
      auVar3 = vsubpd_avx(auVar4,local_a8);
      dStack_88 = auVar2._0_8_ * 999999999.9999999;
      dStack_80 = auVar2._8_8_ * 999999999.9999999;
      dStack_78 = auVar3._0_8_ * 999999999.9999999;
      dStack_70 = auVar3._8_8_ * 999999999.9999999;
      if (((pCVar6->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 6) ||
         ((pCVar6->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar9)) break;
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x50403020100));
      lVar9 = lVar9 + 1;
      lVar1 = (pCVar6->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      auVar14._8_8_ = lVar1;
      auVar14._0_8_ = lVar1;
      auVar14._16_8_ = lVar1;
      auVar14._24_8_ = lVar1;
      auVar14._32_8_ = lVar1;
      auVar14._40_8_ = lVar1;
      auVar14._48_8_ = lVar1;
      auVar14._56_8_ = lVar1;
      auVar14 = vpmullq_avx512dq(auVar13,auVar14);
      uVar12 = CONCAT71((int7)((ulong)pCVar8 >> 8),0x3f) & 0xffffffff;
      vscatterqpd_avx512f(ZEXT864((ulong)((long)(pCVar6->
                                                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                ).
                                                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                .
                                                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                .m_data + lVar11)) + auVar14 * (undefined1  [64])0x8
                          ,uVar12,ZEXT4864(CONCAT840((ulong)((byte)(uVar12 >> 5) & 1) *
                                                     (long)dStack_70,
                                                     CONCAT832((ulong)((byte)(uVar12 >> 4) & 1) *
                                                               (long)dStack_78,
                                                               CONCAT824((ulong)((byte)(uVar12 >> 3)
                                                                                & 1) *
                                                                         (long)dStack_80,
                                                                         CONCAT816((ulong)((byte)(
                                                  uVar12 >> 2) & 1) * (long)dStack_88,
                                                  CONCAT88((ulong)((byte)(uVar12 >> 1) & 1) *
                                                           (long)dStack_90,
                                                           (ulong)((byte)uVar12 & 1) *
                                                           (long)local_98)))))));
      *(double *)(local_1a8 + lVar11) = *(double *)(local_1a8 + lVar11) + -1e-09;
      lVar11 = lVar11 + 8;
      if (lVar9 == 6) {
        return;
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  __assert_fail("R.cols() == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                ,0x174,
                "virtual void chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChDampingKirchhoff::ComputeDampingMatrix(
    ChMatrixRef R,             // 6x6 material damping matrix values here
    const ChVector<>& deps,  // time derivative of strains 
    const ChVector<>& dkur,  // time derivative of curvatures
    const double z_inf,        // layer lower z value (along thickness coord)
    const double z_sup,        // layer upper z value (along thickness coord)
    const double angle         // layer angle respect to x (if needed) -not used in this, isotropic+
) {
    assert(R.rows() == 6);
    assert(R.cols() == 6);

    R.setZero();

    ChVectorN<double, 6> dstrain_0;
    dstrain_0.segment(0, 3) = deps.eigen();
    dstrain_0.segment(3, 3) = dkur.eigen();

    ChVector<> n, m;
    this->ComputeStress(n, m, deps, dkur, z_inf, z_sup, angle);

    ChVectorN<double, 6> stress_0;
    stress_0.segment(0,3) = n.eigen();
    stress_0.segment(3,3) = m.eigen();
    

    double delta = 1e-9;
    for (int i = 0; i < 6; ++i) {
        dstrain_0(i, 0) += delta;
        ChVector<> ddeps(dstrain_0.segment(0, 3));
        ChVector<> ddkur(dstrain_0.segment(3, 3));
        this->ComputeStress(n, m, ddeps, ddkur, z_inf, z_sup, angle);
        ChVectorN<double, 6> stress_1;
        stress_1.segment(0,3) = n.eigen();
        stress_1.segment(3,3) = m.eigen();
        ChVectorN<double, 6> stress_d = (1. / delta) * (stress_1 - stress_0);
        R.block(0, i, 6, 1) = stress_d;
        dstrain_0(i, 0) -= delta;
    }
}